

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture_GetImageOffsetTest_InvalidOpOnLevelFaceLayerTooBig_Test::
TestBody(ktxTexture_GetImageOffsetTest_InvalidOpOnLevelFaceLayerTooBig_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_size_t offset;
  ktx_error_code_e result;
  TestCreateInfo createInfo;
  ktxTexture *texture;
  char (*in_stack_fffffffffffffe68) [28];
  AssertionResult *in_stack_fffffffffffffe70;
  ktx_error_code_e *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffe88;
  int line;
  char *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  Type type;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult local_140;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  AssertionResult *in_stack_fffffffffffffee8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffef0;
  AssertionResult local_f0;
  uint local_dc;
  string local_d8 [40];
  char *local_b0;
  undefined1 local_99;
  AssertionResult local_98 [3];
  undefined4 local_64;
  AssertionResult local_60;
  undefined1 local_50 [12];
  undefined4 local_44;
  undefined1 local_40 [32];
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_10[0] = 0;
  TestCreateInfo::TestCreateInfo((TestCreateInfo *)0x143be8);
  local_44 = ktxTexture1_Create(local_40,0,local_10);
  local_64 = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            ((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (ktx_error_code_e *)in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffea0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x143c70);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
               (Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x143ccd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x143d3b);
  local_99 = local_10[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe70,(bool *)in_stack_fffffffffffffe68,(type *)0x143d69);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    pMVar2 = testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    type = (Type)((ulong)pMVar2 >> 0x20);
    in_stack_fffffffffffffe90 = (char *)ktxErrorString(local_44);
    local_b0 = in_stack_fffffffffffffe90;
    in_stack_fffffffffffffe88 =
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffffe70,(char **)in_stack_fffffffffffffe68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffee8,
               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
               (Message *)in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x143e8d);
  }
  local_dc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x143f3a);
  if (local_dc == 0) {
    (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],local_20,0,0,local_50);
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
               ,(ktx_error_code_e *)in_stack_fffffffffffffe70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe80 =
           testing::AssertionResult::failure_message((AssertionResult *)0x143ffc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                 (Message *)in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x144059);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1440ca);
    (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],0,local_1c,0,local_50);
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
               ,(ktx_error_code_e *)in_stack_fffffffffffffe70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffee8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe78 =
           (ktx_error_code_e *)
           testing::AssertionResult::failure_message((AssertionResult *)0x14416b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,
                 (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                 (Message *)in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x1441b9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x144221);
    (**(code **)(*(long *)(local_10[0] + 8) + 8))(local_10[0],0,0,local_18,local_50);
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
               ,(ktx_error_code_e *)in_stack_fffffffffffffe70);
    line = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x1442b9);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,type,in_stack_fffffffffffffe90,line,
                 in_stack_fffffffffffffe80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffef0._M_head_impl,
                 (Message *)in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x144307);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x144369);
    if (local_10[0] != 0) {
      (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
    }
  }
  return;
}

Assistant:

TEST(ktxTexture_GetImageOffsetTest, InvalidOpOnLevelFaceLayerTooBig) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo;
    KTX_error_code result;
    ktx_size_t offset;

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, createInfo.numLevels, 0, 0, &offset),
              KTX_INVALID_OPERATION);
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 0, createInfo.numLayers, 0, &offset),
              KTX_INVALID_OPERATION);
    EXPECT_EQ(ktxTexture_GetImageOffset(texture, 0, 0, createInfo.numFaces, &offset),
              KTX_INVALID_OPERATION);
    if (texture)
        ktxTexture_Destroy(texture);
}